

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

void __thiscall flexbuffers::Builder::Clear(Builder *this)

{
  pointer puVar1;
  pointer pVVar2;
  
  puVar1 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pVVar2 = (this->stack_).
           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->stack_).
    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  this->finished_ = false;
  this->force_min_bit_width_ = BIT_WIDTH_8;
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
  ::clear(&(this->key_pool)._M_t);
  std::
  _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>,_std::_Identity<std::pair<unsigned_long,_unsigned_long>_>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::clear(&(this->string_pool)._M_t);
  return;
}

Assistant:

void Clear() {
    buf_.clear();
    stack_.clear();
    finished_ = false;
    // flags_ remains as-is;
    force_min_bit_width_ = BIT_WIDTH_8;
    key_pool.clear();
    string_pool.clear();
  }